

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

String * __thiscall kj::_::Event::traceEvent(String *__return_storage_ptr__,Event *this)

{
  TraceBuilder builder;
  void *space [32];
  String local_158;
  TraceBuilder local_140;
  void *local_128 [32];
  void *local_28;
  
  memset(local_128,0,0x100);
  local_140.limit = &local_28;
  local_140.start = local_128;
  local_140.current = local_128;
  (**this->_vptr_Event)(this,&local_140);
  TraceBuilder::toString(&local_158,&local_140);
  (__return_storage_ptr__->content).ptr = local_158.content.ptr;
  (__return_storage_ptr__->content).size_ = local_158.content.size_;
  (__return_storage_ptr__->content).disposer = local_158.content.disposer;
  return __return_storage_ptr__;
}

Assistant:

String Event::traceEvent() {
  void* space[32]{};
  TraceBuilder builder(space);
  traceEvent(builder);
  return kj::str(builder);
}